

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

int __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>
::int_writer<fmt::v5::char8_t,fmt::v5::basic_format_specs<fmt::v5::char8_t>>::count_digits<4u>
          (int_writer<fmt::v5::char8_t,_fmt::v5::basic_format_specs<fmt::v5::char8_t>_> *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = 0;
  uVar3 = this->abs_value;
  do {
    iVar2 = iVar2 + 1;
    bVar1 = 0xf < uVar3;
    uVar3 = uVar3 >> 4;
  } while (bVar1);
  return iVar2;
}

Assistant:

int count_digits() const {
      unsigned_type n = abs_value;
      int num_digits = 0;
      do {
        ++num_digits;
      } while ((n >>= BITS) != 0);
      return num_digits;
    }